

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O1

int32_t __thiscall
icu_63::number::impl::CurrencySpacingEnabledModifier::apply
          (CurrencySpacingEnabledModifier *this,NumberStringBuilder *output,int leftIndex,
          int rightIndex,UErrorCode *status)

{
  UBool UVar1;
  UChar32 UVar2;
  int32_t iVar3;
  int32_t iVar4;
  
  iVar3 = 0;
  if ((leftIndex < rightIndex) && (((this->fAfterPrefixUnicodeSet).fFlags & 1) == 0)) {
    UVar2 = NumberStringBuilder::codePointAt(output,leftIndex);
    UVar1 = UnicodeSet::contains(&this->fAfterPrefixUnicodeSet,UVar2);
    if (UVar1 != '\0') {
      iVar3 = NumberStringBuilder::insert
                        (output,leftIndex,&this->fAfterPrefixInsert,UNUM_FIELD_COUNT,status);
    }
  }
  if ((leftIndex < rightIndex) && (((this->fBeforeSuffixUnicodeSet).fFlags & 1) == 0)) {
    UVar2 = NumberStringBuilder::codePointBefore(output,rightIndex);
    UVar1 = UnicodeSet::contains(&this->fBeforeSuffixUnicodeSet,UVar2);
    if (UVar1 != '\0') {
      iVar4 = NumberStringBuilder::insert
                        (output,rightIndex + iVar3,&this->fBeforeSuffixInsert,UNUM_FIELD_COUNT,
                         status);
      iVar3 = iVar4 + iVar3;
    }
  }
  iVar4 = ConstantMultiFieldModifier::apply
                    (&this->super_ConstantMultiFieldModifier,output,leftIndex,rightIndex + iVar3,
                     status);
  return iVar4 + iVar3;
}

Assistant:

int32_t CurrencySpacingEnabledModifier::apply(NumberStringBuilder &output, int leftIndex, int rightIndex,
                                              UErrorCode &status) const {
    // Currency spacing logic
    int length = 0;
    if (rightIndex - leftIndex > 0 && !fAfterPrefixUnicodeSet.isBogus() &&
        fAfterPrefixUnicodeSet.contains(output.codePointAt(leftIndex))) {
        // TODO: Should we use the CURRENCY field here?
        length += output.insert(leftIndex, fAfterPrefixInsert, UNUM_FIELD_COUNT, status);
    }
    if (rightIndex - leftIndex > 0 && !fBeforeSuffixUnicodeSet.isBogus() &&
        fBeforeSuffixUnicodeSet.contains(output.codePointBefore(rightIndex))) {
        // TODO: Should we use the CURRENCY field here?
        length += output.insert(rightIndex + length, fBeforeSuffixInsert, UNUM_FIELD_COUNT, status);
    }

    // Call super for the remaining logic
    length += ConstantMultiFieldModifier::apply(output, leftIndex, rightIndex + length, status);
    return length;
}